

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

bool __thiscall ThreadContext::IsActivePropertyId(ThreadContext *this,PropertyId pid)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  int propertyIndex;
  PropertyId pid_local;
  ThreadContext *this_local;
  
  propertyRecord._4_4_ = pid;
  _propertyIndex = this;
  if (pid == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x4cb,"(pid != Js::Constants::NoProperty)",
                       "pid != Js::Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = Js::IsInternalPropertyId(propertyRecord._4_4_);
  if (BVar3 == 0) {
    propertyRecord._0_4_ = propertyRecord._4_4_ + -0x10;
    bVar2 = JsUtil::
            BaseHashSet<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
            ::TryGetValueAt(this->propertyMap,(int)propertyRecord,&local_28);
    if ((bVar2) && (local_28 != (PropertyRecord *)0x0)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ThreadContext::IsActivePropertyId(Js::PropertyId pid)
{
    Assert(pid != Js::Constants::NoProperty);
    if (Js::IsInternalPropertyId(pid))
    {
        return true;
    }

    int propertyIndex = pid - Js::PropertyIds::_none;

    const Js::PropertyRecord * propertyRecord;
    if (propertyMap->TryGetValueAt(propertyIndex, &propertyRecord) && propertyRecord != nullptr)
    {
        return true;
    }

    return false;
}